

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

Parser * __thiscall c4::yml::Parser::operator=(Parser *this,Parser *that)

{
  Location loc;
  bool bVar1;
  error_flags eVar2;
  uint32_t *in_RSI;
  Parser *in_RDI;
  undefined1 in_stack_00000000 [24];
  stack<c4::yml::Parser::State,_16UL> *in_stack_ffffffffffffff88;
  Parser *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  Location *in_stack_ffffffffffffffa0;
  Parser *pPStack_28;
  char (*in_stack_ffffffffffffffe0) [25];
  undefined8 in_stack_fffffffffffffff0;
  stack<c4::yml::Parser::State,_16UL> *psVar3;
  
  _free(in_stack_ffffffffffffff90);
  (in_RDI->m_options).flags = *in_RSI;
  (in_RDI->m_file).str = *(char **)(in_RSI + 2);
  (in_RDI->m_file).len = *(size_t *)(in_RSI + 4);
  (in_RDI->m_buf).str = *(char **)(in_RSI + 6);
  (in_RDI->m_buf).len = *(size_t *)(in_RSI + 8);
  in_RDI->m_root_id = *(size_t *)(in_RSI + 10);
  in_RDI->m_tree = *(Tree **)(in_RSI + 0xc);
  detail::stack<c4::yml::Parser::State,_16UL>::operator=
            ((stack<c4::yml::Parser::State,_16UL> *)in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88);
  psVar3 = &in_RDI->m_stack;
  if ((in_RDI->m_stack).m_size == 0) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    Location::Location(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                       (size_t)in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88);
    loc.super_LineCol.line = (size_t)psVar3;
    loc.super_LineCol.offset = in_stack_fffffffffffffff0;
    loc._16_24_ = in_stack_00000000;
    error<25ul>(in_stack_ffffffffffffffe0,loc);
    in_stack_ffffffffffffff90 = pPStack_28;
  }
  in_RDI->m_state = (in_RDI->m_stack).m_stack + ((in_RDI->m_stack).m_size - 1);
  in_RDI->m_key_tag_indentation = *(size_t *)(in_RSI + 0x27e);
  in_RDI->m_key_tag2_indentation = *(size_t *)(in_RSI + 0x280);
  (in_RDI->m_key_tag).str = *(char **)(in_RSI + 0x282);
  (in_RDI->m_key_tag).len = *(size_t *)(in_RSI + 0x284);
  (in_RDI->m_key_tag2).str = *(char **)(in_RSI + 0x286);
  (in_RDI->m_key_tag2).len = *(size_t *)(in_RSI + 0x288);
  in_RDI->m_val_tag_indentation = *(size_t *)(in_RSI + 0x28a);
  (in_RDI->m_val_tag).str = *(char **)(in_RSI + 0x28c);
  (in_RDI->m_val_tag).len = *(size_t *)(in_RSI + 0x28e);
  in_RDI->m_key_anchor_was_before = (bool)((byte)in_RSI[0x290] & 1);
  in_RDI->m_key_anchor_indentation = *(size_t *)(in_RSI + 0x292);
  (in_RDI->m_key_anchor).str = *(char **)(in_RSI + 0x294);
  (in_RDI->m_key_anchor).len = *(size_t *)(in_RSI + 0x296);
  in_RDI->m_val_anchor_indentation = *(size_t *)(in_RSI + 0x298);
  (in_RDI->m_val_anchor).str = *(char **)(in_RSI + 0x29a);
  (in_RDI->m_val_anchor).len = *(size_t *)(in_RSI + 0x29c);
  (in_RDI->m_filter_arena).str = *(char **)(in_RSI + 0x29e);
  (in_RDI->m_filter_arena).len = *(size_t *)(in_RSI + 0x2a0);
  in_RDI->m_newline_offsets = *(size_t **)(in_RSI + 0x2a2);
  in_RDI->m_newline_offsets_size = *(size_t *)(in_RSI + 0x2a4);
  in_RDI->m_newline_offsets_capacity = *(size_t *)(in_RSI + 0x2a6);
  (in_RDI->m_newline_offsets_buf).str = *(char **)(in_RSI + 0x2a8);
  (in_RDI->m_newline_offsets_buf).len = *(size_t *)(in_RSI + 0x2aa);
  _clr(in_stack_ffffffffffffff90);
  return in_RDI;
}

Assistant:

Parser& Parser::operator=(Parser &&that)
{
    _free();
    m_options = (that.m_options);
    m_file = (that.m_file);
    m_buf = (that.m_buf);
    m_root_id = (that.m_root_id);
    m_tree = (that.m_tree);
    m_stack = std::move(that.m_stack);
    m_state = (&m_stack.top());
    m_key_tag_indentation = (that.m_key_tag_indentation);
    m_key_tag2_indentation = (that.m_key_tag2_indentation);
    m_key_tag = (that.m_key_tag);
    m_key_tag2 = (that.m_key_tag2);
    m_val_tag_indentation = (that.m_val_tag_indentation);
    m_val_tag = (that.m_val_tag);
    m_key_anchor_was_before = (that.m_key_anchor_was_before);
    m_key_anchor_indentation = (that.m_key_anchor_indentation);
    m_key_anchor = (that.m_key_anchor);
    m_val_anchor_indentation = (that.m_val_anchor_indentation);
    m_val_anchor = (that.m_val_anchor);
    m_filter_arena = that.m_filter_arena;
    m_newline_offsets = (that.m_newline_offsets);
    m_newline_offsets_size = (that.m_newline_offsets_size);
    m_newline_offsets_capacity = (that.m_newline_offsets_capacity);
    m_newline_offsets_buf = (that.m_newline_offsets_buf);
    that._clr();
    return *this;
}